

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

block * gen_snap(compiler_state_t *cstate,bpf_u_int32 orgcode,bpf_u_int32 ptype)

{
  block *pbVar1;
  u_char local_20 [4];
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  u_char snapblock [8];
  bpf_u_int32 ptype_local;
  bpf_u_int32 orgcode_local;
  compiler_state_t *cstate_local;
  
  local_20[0] = 0xaa;
  local_20[1] = 0xaa;
  local_20[2] = 3;
  local_20[3] = (u_char)(orgcode >> 0x10);
  local_1c = (undefined1)(orgcode >> 8);
  local_1b = (undefined1)orgcode;
  local_1a = (undefined1)(ptype >> 8);
  local_19 = (undefined1)ptype;
  snapblock._0_4_ = ptype;
  snapblock._4_4_ = orgcode;
  pbVar1 = gen_bcmp(cstate,OR_LLC,0,8,local_20);
  return pbVar1;
}

Assistant:

static struct block *
gen_snap(compiler_state_t *cstate, bpf_u_int32 orgcode, bpf_u_int32 ptype)
{
	u_char snapblock[8];

	snapblock[0] = LLCSAP_SNAP;	/* DSAP = SNAP */
	snapblock[1] = LLCSAP_SNAP;	/* SSAP = SNAP */
	snapblock[2] = 0x03;		/* control = UI */
	snapblock[3] = (orgcode >> 16);	/* upper 8 bits of organization code */
	snapblock[4] = (orgcode >> 8);	/* middle 8 bits of organization code */
	snapblock[5] = (orgcode >> 0);	/* lower 8 bits of organization code */
	snapblock[6] = (ptype >> 8);	/* upper 8 bits of protocol type */
	snapblock[7] = (ptype >> 0);	/* lower 8 bits of protocol type */
	return gen_bcmp(cstate, OR_LLC, 0, 8, snapblock);
}